

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall irr::video::COpenGLDriver::createMaterialRenderers(COpenGLDriver *this)

{
  IMaterialRenderer *pIVar1;
  
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x281b20;
  *(undefined8 *)&pIVar1->field_0x10 = 0x281b78;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x281bb8;
  *(undefined8 *)&pIVar1->field_0x10 = 0x281c10;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x281c50;
  *(undefined8 *)&pIVar1->field_0x10 = 0x281ca8;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x281ce8;
  *(undefined8 *)&pIVar1->field_0x10 = 0x281d40;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  pIVar1 = (IMaterialRenderer *)operator_new(0x28);
  *(undefined8 *)&pIVar1->field_0x18 = 0;
  *(undefined4 *)&pIVar1[1]._vptr_IMaterialRenderer = 1;
  pIVar1->_vptr_IMaterialRenderer = (_func_int **)0x281d80;
  *(undefined8 *)&pIVar1->field_0x10 = 0x281dd8;
  *(COpenGLDriver **)&pIVar1->field_0x8 = this;
  CNullDriver::addAndDropMaterialRenderer(&this->super_CNullDriver,pIVar1);
  return;
}

Assistant:

void COpenGLDriver::createMaterialRenderers()
{
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_SOLID(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_ALPHA_CHANNEL_REF(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_TRANSPARENT_VERTEX_ALPHA(this));
	addAndDropMaterialRenderer(new COpenGLMaterialRenderer_ONETEXTURE_BLEND(this));
}